

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O1

void __thiscall
solitaire::SolitaireHandWithTwoCardsTest_addCardOnTableauPileWithoutHistoryRecord_Test::TestBody
          (SolitaireHandWithTwoCardsTest_addCardOnTableauPileWithoutHistoryRecord_Test *this)

{
  StrictSnapshotMockPtr *snapshot;
  TypedExpectation<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  *this_00;
  ActionInterface<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  *impl;
  TypedExpectation<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  *this_01;
  Cards *pCVar1;
  pointer *__ptr;
  Solitaire *this_02;
  char *in_R9;
  bool bVar2;
  InSequence seq;
  AssertionResult gtest_ar_;
  Cards cardsToAdd;
  InSequence local_79;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  AssertHelper local_70;
  undefined1 local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_48 [8];
  VTable *local_40;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_30;
  PileId local_14;
  
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_30,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             (anonymous_namespace)::twoCards);
  testing::InSequence::InSequence(&local_79);
  snapshot = &(this->super_SolitaireHandWithTwoCardsTest).snapshotMock2;
  SolitaireEmptyHandTest::expectSnapshotCreation<solitaire::piles::TableauPileMock>
            ((SolitaireEmptyHandTest *)this,
             (this->super_SolitaireHandWithTwoCardsTest).super_SolitaireEmptyHandTest.
             super_SolitaireTest.lastTableauPileMock,snapshot);
  SolitaireEmptyHandTest::expectTryingAddCardsAndClearThem<solitaire::piles::TableauPileMock>
            ((SolitaireEmptyHandTest *)this,
             (this->super_SolitaireHandWithTwoCardsTest).super_SolitaireEmptyHandTest.
             super_SolitaireTest.lastTableauPileMock,&local_30);
  this_00 = SolitaireEmptyHandTest::expectMoveOperationSnapshotCreation
                      ((SolitaireEmptyHandTest *)this,snapshot);
  impl = (ActionInterface<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
          *)operator_new(0x10);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_00324370;
  testing::
  Action<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  ::Action((Action<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
            *)local_68,impl);
  testing::internal::
  TypedExpectation<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  ::WillOnce(this_00,(Action<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
                      *)local_68);
  if ((VTable *)local_58._M_allocated_capacity != (VTable *)0x0) {
    (*(code *)local_58._M_allocated_capacity)(local_68,local_68,3);
  }
  local_40 = (VTable *)
             testing::internal::
             MatcherBase<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,std::default_delete<solitaire::archivers::interfaces::Snapshot>>>
             ::
             GetVTable<testing::internal::MatcherBase<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,std::default_delete<solitaire::archivers::interfaces::Snapshot>>>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
             ::kVTable;
  local_48 = (undefined1  [8])&PTR__MatcherBase_003220b0;
  archivers::HistoryTrackerMock::gmock_save
            ((MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
              *)local_68,
             &((this->super_SolitaireHandWithTwoCardsTest).super_SolitaireEmptyHandTest.
               super_SolitaireTest.historyTrackerMock.rawPointer)->super_HistoryTrackerMock,
             (Matcher<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
              *)local_48);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
            ::InternalExpectedAt
                      ((MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
                        *)local_68,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0x21f,"*historyTrackerMock","save(_)");
  testing::internal::
  TypedExpectation<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  ::Times(this_01,0);
  testing::internal::
  MatcherBase<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
  ::~MatcherBase((MatcherBase<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
                  *)(local_68 + 8));
  testing::internal::
  MatcherBase<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
  ::~MatcherBase((MatcherBase<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
                  *)local_48);
  this_02 = &(this->super_SolitaireHandWithTwoCardsTest).super_SolitaireEmptyHandTest.
             super_SolitaireTest.solitaire;
  local_14.t = (anonymous_namespace)::lastTableauPileId;
  Solitaire::tryAddCardsOnTableauPile(this_02,&local_14);
  pCVar1 = Solitaire::getCardsInHand(this_02);
  bVar2 = (pCVar1->
          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
          _M_impl.super__Vector_impl_data._M_start ==
          (pCVar1->
          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
          _M_impl.super__Vector_impl_data._M_finish;
  local_48[0] = bVar2;
  local_40 = (VTable *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_68,(internal *)local_48,
               (AssertionResult *)"solitaire.getCardsInHand().empty()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,0x222,(char *)local_68._0_8_);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._0_8_ != &local_58) {
      operator_delete((void *)local_68._0_8_,(ulong)(local_58._M_allocated_capacity + 1));
    }
    if (local_78._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_head_impl + 8))();
    }
  }
  if (local_40 != (VTable *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  }
  testing::InSequence::~InSequence(&local_79);
  if (local_30.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F(SolitaireHandWithTwoCardsTest, addCardOnTableauPileWithoutHistoryRecord) {
    auto cardsToAdd {twoCards};

    InSequence seq;
    expectSnapshotCreation(lastTableauPileMock, snapshotMock2);
    expectTryingAddCardsAndClearThem(lastTableauPileMock, cardsToAdd);
    expectMoveOperationSnapshotCreation(snapshotMock2).WillOnce(ReturnNull());
    EXPECT_CALL(*historyTrackerMock, save(_)).Times(0);

    solitaire.tryAddCardsOnTableauPile(lastTableauPileId);
    EXPECT_TRUE(solitaire.getCardsInHand().empty());
}